

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  int iVar1;
  XSerializerHandlers *this;
  BinMemOutputStream *this_00;
  MemoryManager *pMVar2;
  XMLGrammarPoolImpl *pXVar3;
  SAX2XMLReader *pSVar4;
  BinMemInputStream *this_01;
  uchar *puVar5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  BinMemOutputStream *pBVar10;
  char *pcVar11;
  char *local_650;
  ifstream fin;
  byte abStack_600 [488];
  char fURI [1000];
  
  if (1 < argC) {
    localeStr[0x30] = '\0';
    localeStr[0x31] = '\0';
    localeStr[0x32] = '\0';
    localeStr[0x33] = '\0';
    localeStr[0x34] = '\0';
    localeStr[0x35] = '\0';
    localeStr[0x36] = '\0';
    localeStr[0x37] = '\0';
    localeStr[0x38] = '\0';
    localeStr[0x39] = '\0';
    localeStr[0x3a] = '\0';
    localeStr[0x3b] = '\0';
    localeStr[0x3c] = '\0';
    localeStr[0x3d] = '\0';
    localeStr[0x3e] = '\0';
    localeStr[0x3f] = '\0';
    localeStr[0x20] = '\0';
    localeStr[0x21] = '\0';
    localeStr[0x22] = '\0';
    localeStr[0x23] = '\0';
    localeStr[0x24] = '\0';
    localeStr[0x25] = '\0';
    localeStr[0x26] = '\0';
    localeStr[0x27] = '\0';
    localeStr[0x28] = '\0';
    localeStr[0x29] = '\0';
    localeStr[0x2a] = '\0';
    localeStr[0x2b] = '\0';
    localeStr[0x2c] = '\0';
    localeStr[0x2d] = '\0';
    localeStr[0x2e] = '\0';
    localeStr[0x2f] = '\0';
    localeStr[0x10] = '\0';
    localeStr[0x11] = '\0';
    localeStr[0x12] = '\0';
    localeStr[0x13] = '\0';
    localeStr[0x14] = '\0';
    localeStr[0x15] = '\0';
    localeStr[0x16] = '\0';
    localeStr[0x17] = '\0';
    localeStr[0x18] = '\0';
    localeStr[0x19] = '\0';
    localeStr[0x1a] = '\0';
    localeStr[0x1b] = '\0';
    localeStr[0x1c] = '\0';
    localeStr[0x1d] = '\0';
    localeStr[0x1e] = '\0';
    localeStr[0x1f] = '\0';
    localeStr[0] = '\0';
    localeStr[1] = '\0';
    localeStr[2] = '\0';
    localeStr[3] = '\0';
    localeStr[4] = '\0';
    localeStr[5] = '\0';
    localeStr[6] = '\0';
    localeStr[7] = '\0';
    localeStr[8] = '\0';
    localeStr[9] = '\0';
    localeStr[10] = '\0';
    localeStr[0xb] = '\0';
    localeStr[0xc] = '\0';
    localeStr[0xd] = '\0';
    localeStr[0xe] = '\0';
    localeStr[0xf] = '\0';
    pcVar11 = localeStr;
    for (uVar7 = 1; (uint)argC != uVar7; uVar7 = uVar7 + 1) {
      pcVar8 = argV[uVar7];
      if (*pcVar8 != '-') {
        if (argC != (int)uVar7) {
          if (localeStr[0] == '\0') {
            pcVar11 = (char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
          }
          xercesc_4_0::XMLPlatformUtils::Initialize
                    (pcVar11,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
          if (recognizeNEL == '\x01') {
            xercesc_4_0::XMLPlatformUtils::recognizeNEL
                      (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
          std::ifstream::ifstream(&fin);
          if (doList == '\x01') {
            std::ifstream::open((char *)&fin,(_Ios_Openmode)argV[uVar7]);
          }
          if ((abStack_600[*(long *)(_fin + -0x18)] & 5) == 0) goto LAB_00103c05;
          poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
          poVar6 = std::operator<<(poVar6,argV[uVar7]);
          std::endl<char,std::char_traits<char>>(poVar6);
          iVar1 = 2;
          goto LAB_0010419e;
        }
        break;
      }
      if ((pcVar8[1] == '?') && (pcVar8[2] == '\0')) {
        usage();
        return 2;
      }
      if (((pcVar8[1] == 'v') && (pcVar8[2] == '=')) || ((pcVar8[1] == 'V' && (pcVar8[2] == '='))))
      {
        pcVar8 = pcVar8 + 3;
        iVar1 = strcmp(pcVar8,"never");
        if (iVar1 == 0) {
          valScheme = Val_Never;
        }
        else {
          iVar1 = strcmp(pcVar8,"auto");
          if (iVar1 == 0) {
            valScheme = Val_Auto;
          }
          else {
            iVar1 = strcmp(pcVar8,"always");
            if (iVar1 != 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
              poVar6 = std::operator<<(poVar6,pcVar8);
              std::endl<char,std::char_traits<char>>(poVar6);
              return 2;
            }
            valScheme = Val_Always;
          }
        }
      }
      else if (((pcVar8[1] == 'n') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'N' && (pcVar8[2] == '\0')))) {
        doNamespaces = 1;
      }
      else if (((pcVar8[1] == 's') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'S' && (pcVar8[2] == '\0')))) {
        doSchema = 1;
      }
      else if (((pcVar8[1] == 'f') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'F' && (pcVar8[2] == '\0')))) {
        schemaFullChecking = 1;
      }
      else if (((pcVar8[1] == 'l') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'L' && (pcVar8[2] == '\0')))) {
        doList = '\x01';
      }
      else if (((pcVar8[1] == 'p') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'P' && (pcVar8[2] == '\0')))) {
        namespacePrefixes = 1;
      }
      else {
        iVar1 = strcmp(pcVar8,"-special:nel");
        if (iVar1 == 0) {
          recognizeNEL = '\x01';
        }
        else {
          iVar1 = strncmp(pcVar8,"-locale=",8);
          if (iVar1 == 0) {
            strcpy(localeStr,pcVar8 + 8);
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
            poVar6 = std::operator<<(poVar6,argV[uVar7]);
            poVar6 = std::operator<<(poVar6,"\', ignoring it\n");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
      }
    }
  }
  usage();
  return 1;
LAB_00103c05:
  pcVar11 = (char *)0x0;
  memset(fURI,0,1000);
  if (doList == '\x01') {
    if ((abStack_600[*(long *)(_fin + -0x18)] & 2) == 0) goto LAB_00103c36;
    std::ifstream::close();
  }
  else {
    iVar1 = (int)uVar7;
    if (iVar1 < argC) {
      local_650 = argV[iVar1];
      uVar7 = (ulong)(iVar1 + 1);
      goto LAB_00103cae;
    }
  }
  goto LAB_0010418f;
LAB_00103c36:
  std::istream::getline((char *)&fin,(long)fURI);
  if (fURI[0] != '\0') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    pcVar11 = fURI;
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar6);
    local_650 = fURI;
LAB_00103cae:
    if (handler == (XSerializerHandlers *)0x0) {
      this = (XSerializerHandlers *)operator_new(0x58);
      XSerializerHandlers::XSerializerHandlers(this);
      handler = this;
    }
    this_00 = (BinMemOutputStream *)
              xercesc_4_0::XMemory::operator_new((XMemory *)0x28,(ulong)pcVar11);
    uVar9 = 0x400;
    xercesc_4_0::BinMemOutputStream::BinMemOutputStream
              (this_00,0x400,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pMVar2 = (MemoryManager *)operator_new(8);
    pMVar2->_vptr_MemoryManager = (_func_int **)std::operator<<;
    pXVar3 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar9);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar3,pMVar2);
    pSVar4 = getParser((XMLGrammarPool *)pXVar3,false);
    (*pSVar4->_vptr_SAX2XMLReader[0xc])
              (pSVar4,&xercesc_4_0::XMLUni::fgXercesCacheGrammarFromParse,1);
    (*pSVar4->_vptr_SAX2XMLReader[0x10])(pSVar4,local_650);
    pBVar10 = this_00;
    (**(code **)(*(long *)pXVar3 + 0x78))(pXVar3);
    (*pSVar4->_vptr_SAX2XMLReader[1])(pSVar4);
    (**(code **)(*(long *)pXVar3 + 8))(pXVar3);
    (*pMVar2->_vptr_MemoryManager[1])(pMVar2);
    this_01 = (BinMemInputStream *)
              xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)pBVar10);
    puVar5 = (uchar *)xercesc_4_0::BinMemOutputStream::getRawBuffer();
    uVar9 = xercesc_4_0::BinMemOutputStream::getSize();
    xercesc_4_0::BinMemInputStream::BinMemInputStream
              (this_01,puVar5,uVar9,BufOpt_Reference,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
    ;
    pMVar2 = (MemoryManager *)operator_new(8);
    pMVar2->_vptr_MemoryManager = (_func_int **)std::operator<<;
    pXVar3 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)puVar5)
    ;
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar3,pMVar2);
    (**(code **)(*(long *)pXVar3 + 0x80))(pXVar3,this_01);
    pSVar4 = getParser((XMLGrammarPool *)pXVar3,true);
    (*pSVar4->_vptr_SAX2XMLReader[0xc])
              (pSVar4,&xercesc_4_0::XMLUni::fgXercesUseCachedGrammarInParse,1);
    (*(handler->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver[0x12])();
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (*pSVar4->_vptr_SAX2XMLReader[0x10])(pSVar4);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (handler->fSawErrors == false) {
      poVar6 = std::operator<<((ostream *)&std::cout,local_650);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," ms (");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," elems, ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," attrs, ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," spaces, ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," chars)");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      errorOccurred = 1;
    }
    (*pSVar4->_vptr_SAX2XMLReader[1])(pSVar4);
    (**(code **)(*(long *)pXVar3 + 8))(pXVar3);
    (*pMVar2->_vptr_MemoryManager[1])();
    (**(code **)(*(long *)this_01 + 8))();
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  goto LAB_00103c05;
LAB_0010418f:
  xercesc_4_0::XMLPlatformUtils::Terminate();
  iVar1 = (uint)errorOccurred << 2;
LAB_0010419e:
  std::ifstream::~ifstream(&fin);
  return iVar1;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAX2XMLReader::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAX2XMLReader::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAX2XMLReader::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = false;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = false;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-p")
              ||  !strcmp(argV[argInd], "-P"))
        {
            namespacePrefixes = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }

    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        parseCase(xmlFile);
    }

    if (doList)
        fin.close();

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}